

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O0

int rng_nextrand(RNG_state *mystate)

{
  uint_32t b;
  int r;
  sha1_ctx_s ctx;
  RNG_state *mystate_local;
  
  ctx.wbuf._56_8_ = mystate;
  sha1_begin((sha1_ctx *)&b);
  sha1_hash((uchar *)ctx.wbuf._56_8_,0x14,(sha1_ctx *)&b);
  sha1_end((uchar *)ctx.wbuf._56_8_,(sha1_ctx *)&b);
  return (*(byte *)(ctx.wbuf._56_8_ + 0x10) & 0x7f) << 0x18 |
         (uint)*(byte *)(ctx.wbuf._56_8_ + 0x11) << 0x10 |
         (uint)*(byte *)(ctx.wbuf._56_8_ + 0x12) << 8 | (uint)*(byte *)(ctx.wbuf._56_8_ + 0x13);
}

Assistant:

int rng_nextrand(RNG_state *mystate){
	struct sha1_context ctx;
	int r;
	uint_32t b;

	sha1_begin(&ctx);
	sha1_hash(mystate, 20, &ctx);
	sha1_end(mystate, &ctx);
	b =  (mystate[16] << 24) | (mystate[17] << 16)
		| (mystate[18] << 8) | (mystate[19] << 0);
	b = b & POS_MASK;
	
	r = (int) b;
	return r;
}